

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# microtar.c
# Opt level: O2

int mtar_write_null_bytes(mtar_t *tar,size_t n)

{
  int iVar1;
  ulong in_RAX;
  long lVar2;
  ulong uStack_28;
  char nul;
  
  uStack_28 = in_RAX & 0xffffffffffffff;
  lVar2 = n + 1;
  do {
    lVar2 = lVar2 + -1;
    if (lVar2 == 0) {
      return 0;
    }
    iVar1 = (*tar->write)(tar,&nul,1);
    tar->pos = tar->pos + 1;
  } while (iVar1 == 0);
  return iVar1;
}

Assistant:

static int mtar_write_null_bytes(mtar_t *tar, size_t n) {
  size_t i;
  int err;
  char nul = '\0';
  for (i = 0; i < n; i++) {
    err = mtar_twrite(tar, &nul, 1);
    if (err) {
      return err;
    }
  }
  return MTAR_ESUCCESS;
}